

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNodes_Declarations.h
# Opt level: O2

void __thiscall
psy::C::ExpressionInitializerSyntax::~ExpressionInitializerSyntax(ExpressionInitializerSyntax *this)

{
  C::SyntaxNode::~SyntaxNode((SyntaxNode *)this);
  Managed::operator_delete(this);
  return;
}

Assistant:

class PSY_C_API ExpressionInitializerSyntax final : public InitializerSyntax
{
    AST_NODE_1K(ExpressionInitializer, Initializer)

public:
    const ExpressionSyntax* expression() const { return expr_; }

private:
    ExpressionSyntax* expr_ = nullptr;
    AST_CHILD_LST1(expr_);
}